

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void rw::decompressDXT5(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  int iVar9;
  uint32 k_2;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  byte *pbVar14;
  uint8 aidx [16];
  uint8 idx [16];
  uint local_c8 [4];
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8 [4];
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_88;
  uint local_84;
  uint local_80;
  undefined8 local_78;
  uint local_70;
  long local_68;
  ulong local_60;
  byte local_58 [40];
  
  local_68 = (long)(h * w);
  local_60 = 0;
  iVar12 = 0;
  for (lVar11 = 0; lVar11 < h * w; lVar11 = lVar11 + 0x10) {
    uVar3 = *(ushort *)(src + lVar11 + 8);
    uVar4 = *(ushort *)(src + lVar11 + 10);
    local_a8[0] = ((uint)(uVar3 >> 0xb) * 0xff) / 0x1f;
    local_a8[1] = ((uVar3 >> 5 & 0x3f) * 0xff) / 0x3f;
    local_a8[2] = ((uVar3 & 0x1f) * 0xff) / 0x1f;
    local_98 = ((uint)(uVar4 >> 0xb) * 0xff) / 0x1f;
    local_94 = ((uVar4 >> 5 & 0x3f) * 0xff) / 0x3f;
    local_90 = ((uVar4 & 0x1f) * 0xff) / 0x1f;
    if (uVar4 < uVar3) {
      local_88 = (local_98 + local_a8[0] * 2) / 3;
      local_84 = (local_94 + local_a8[1] * 2) / 3;
      local_80 = (local_90 + local_a8[2] * 2) / 3;
      local_78 = CONCAT44((local_a8[1] + local_94 * 2) / 3,(local_a8[0] + local_98 * 2) / 3);
      local_70 = (local_a8[2] + local_90 * 2) / 3;
    }
    else {
      local_88 = local_98 + local_a8[0] >> 1;
      local_84 = local_94 + local_a8[1] >> 1;
      local_80 = local_90 + local_a8[2] >> 1;
      local_78 = 0;
      local_70 = 0;
    }
    bVar1 = src[lVar11];
    local_c8[0] = (uint)bVar1;
    bVar2 = src[lVar11 + 1];
    local_c8[1] = (uint)bVar2;
    iVar9 = (uint)bVar2 + (uint)bVar2 * 2;
    if (bVar2 < bVar1) {
      local_c8[2] = ((uint)bVar1 * 6 + (uint)bVar2) / 7;
      local_c8[3] = ((uint)bVar2 + (uint)bVar2 + (uint)bVar1 + (uint)bVar1 * 4) / 7;
      local_b8 = (iVar9 + (uint)bVar1 * 4) / 7;
      local_b4 = ((uint)bVar1 + (uint)bVar1 * 2 + (uint)bVar2 * 4) / 7;
      local_b0 = ((uint)bVar2 + (uint)bVar2 * 4 + (uint)bVar1 * 2) / 7;
      local_ac = ((uint)bVar2 * 6 + (uint)bVar1) / 7;
    }
    else {
      local_c8[2] = ((uint)bVar2 + (uint)bVar1 * 4) / 5;
      local_c8[3] = ((uint)bVar2 + (uint)bVar2 + (uint)bVar1 + (uint)bVar1 * 2) / 5;
      local_b8 = (iVar9 + (uint)bVar1 * 2) / 5;
      local_b4 = ((uint)bVar1 + (uint)bVar2 * 4) / 5;
      local_b0 = 0;
      local_ac = 0xff;
    }
    uVar5 = *(uint *)(src + lVar11 + 0xc);
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      local_58[lVar7 + 0x10] = (byte)uVar5 & 3;
      uVar5 = uVar5 >> 2;
    }
    uVar6 = *(ulong *)(src + lVar11 + 2);
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      local_58[lVar7] = (byte)uVar6 & 7;
      uVar6 = uVar6 >> 3;
    }
    iVar9 = w * (int)local_60 + iVar12;
    pbVar14 = local_58 + 0x10;
    pbVar8 = local_58;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        uVar6 = (ulong)pbVar14[lVar10];
        uVar13 = (ulong)(uint)(iVar9 + (int)lVar10);
        adst[uVar13 * 4] = (uint8)local_a8[uVar6 * 4];
        adst[uVar13 * 4 + 1] = (uint8)local_a8[uVar6 * 4 + 1];
        adst[uVar13 * 4 + 2] = (uint8)local_a8[uVar6 * 4 + 2];
        adst[uVar13 * 4 + 3] = (uint8)local_c8[pbVar8[lVar10]];
      }
      pbVar14 = pbVar14 + 4;
      pbVar8 = pbVar8 + 4;
      iVar9 = iVar9 + w;
    }
    iVar12 = iVar12 + 4;
    if (w <= iVar12) {
      iVar12 = 0;
      local_60 = (ulong)((int)local_60 + 4);
    }
  }
  return;
}

Assistant:

void
decompressDXT5(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint32 a[8];
	uint8 idx[16];
	uint8 aidx[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h; j += 16){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+8]);
		uint32 col1 = *((uint16*)&src[j+10]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;
		if(col0 > col1){
			c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
			c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
			c[2][2] = (2*c[0][2] + 1*c[1][2])/3;

			c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
			c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
			c[3][2] = (1*c[0][2] + 2*c[1][2])/3;
		}else{
			c[2][0] = (c[0][0] + c[1][0])/2;
			c[2][1] = (c[0][1] + c[1][1])/2;
			c[2][2] = (c[0][2] + c[1][2])/2;

			c[3][0] = 0x00;
			c[3][1] = 0x00;
			c[3][2] = 0x00;
		}

		a[0] = src[j+0];
		a[1] = src[j+1];
		if(a[0] > a[1]){
			a[2] = (6*a[0] + 1*a[1])/7;
			a[3] = (5*a[0] + 2*a[1])/7;
			a[4] = (4*a[0] + 3*a[1])/7;
			a[5] = (3*a[0] + 4*a[1])/7;
			a[6] = (2*a[0] + 5*a[1])/7;
			a[7] = (1*a[0] + 6*a[1])/7;
		}else{
			a[2] = (4*a[0] + 1*a[1])/5;
			a[3] = (3*a[0] + 2*a[1])/5;
			a[4] = (2*a[0] + 3*a[1])/5;
			a[5] = (1*a[0] + 4*a[1])/5;
			a[6] = 0;
			a[7] = 0xFF;
		}

		/* make index list */
		uint32 indices = *((uint32*)&src[j+12]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}
		// only 6 indices
		uint64 alphas = *((uint64*)&src[j+2]);
		for(int32 k = 0; k < 16; k++){
			aidx[k] = alphas & 0x7;
			alphas >>= 3;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = a[aidx[l*4+k]];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}